

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O0

void __thiscall
script_segwit_tests::IsPayToWitnessScriptHash_Invalid_NotOp0::test_method
          (IsPayToWitnessScriptHash_Invalid_NotOp0 *this)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar2;
  __extent_storage<18446744073709551615UL> in;
  long in_FS_OFFSET;
  CScript notp2wsh;
  uint256 dummy;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  assertion_result *in_stack_fffffffffffffec8;
  CScript *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined8 in_stack_fffffffffffffee8;
  opcodetype opcode;
  size_t line_num;
  const_string *file;
  const_string local_e8 [2];
  lazy_ostream local_c8 [2];
  assertion_result local_a8 [4];
  const_string local_48;
  
  opcode = (opcodetype)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uint256::uint256((uint256 *)in_stack_fffffffffffffeb8);
  file = &local_48;
  CScript::CScript((CScript *)in_stack_fffffffffffffeb8);
  in._M_extent_value = (size_t)CScript::operator<<((CScript *)file,opcode);
  ToByteVector<uint256>((uint256 *)in._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffec8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  b._M_extent._M_extent_value = in._M_extent_value;
  b._M_ptr = (pointer)file;
  CScript::operator<<(in_stack_fffffffffffffed8,b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec8);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffec8,
               (pointer)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (unsigned_long)in_stack_fffffffffffffeb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in._M_extent_value,file,line_num,
               (const_string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    in_stack_fffffffffffffee7 =
         CScript::IsPayToWitnessScriptHash((CScript *)in_stack_fffffffffffffec8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffec8,(bool)in_stack_fffffffffffffec7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffec8,
               (pointer)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (unsigned_long)in_stack_fffffffffffffeb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffeb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffec8,
               (pointer)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (unsigned_long)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffeb8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_a8,local_c8,local_e8,0x1d,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffeb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffeb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CScript::~CScript((CScript *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPayToWitnessScriptHash_Invalid_NotOp0)
{
    uint256 dummy;
    CScript notp2wsh;
    notp2wsh << OP_1 << ToByteVector(dummy);
    BOOST_CHECK(!notp2wsh.IsPayToWitnessScriptHash());
}